

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiNavLayer IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiWindow *in_RSI;
  ImGuiID in_EDI;
  undefined8 extraout_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  ImRect IVar7;
  ImGuiNavLayer nav_layer;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pIVar6 = GImGui;
  IVar3 = (in_RSI->DC).NavLayerCurrent;
  if (GImGui->NavWindow != in_RSI) {
    GImGui->NavInitRequest = false;
  }
  pIVar6->NavWindow = in_RSI;
  pIVar6->NavId = in_EDI;
  pIVar6->NavLayer = IVar3;
  pIVar6->NavFocusScopeId = (in_RSI->DC).NavFocusScopeIdCurrent;
  in_RSI->NavLastIds[IVar3] = in_EDI;
  if ((pIVar6->LastItemData).ID == in_EDI) {
    IVar7 = WindowRectAbsToRel((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffc8);
    auVar4._8_8_ = extraout_XMM0_Qb;
    auVar4._0_4_ = IVar7.Min.x;
    auVar4._4_4_ = IVar7.Min.y;
    IVar1 = (ImVec2)vmovlpd_avx(auVar4);
    auVar5._8_8_ = in_XMM1_Qb;
    auVar5._0_4_ = IVar7.Max.x;
    auVar5._4_4_ = IVar7.Max.y;
    IVar2 = (ImVec2)vmovlpd_avx(auVar5);
    in_RSI->NavRectRel[IVar3].Min = IVar1;
    in_RSI->NavRectRel[IVar3].Max = IVar2;
  }
  if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar6->NavDisableMouseHover = true;
  }
  else {
    pIVar6->NavDisableHighlight = true;
  }
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}